

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O0

RootBlock * __thiscall SQCompilation::SQParser::parse(SQParser *this)

{
  int iVar1;
  SQParser *pSVar2;
  __jmp_buf_tag *__env;
  SQInteger SVar3;
  SQParser *in_RDI;
  RootBlock *rootBlock;
  bool in_stack_00000177;
  SQParser *in_stack_00000178;
  Arena *in_stack_ffffffffffffffe8;
  SQParser *pSVar4;
  SQParser *local_8;
  
  pSVar2 = in_RDI;
  arena(in_RDI);
  pSVar2 = (SQParser *)newNode<SQCompilation::RootBlock,Arena*>(pSVar2,in_stack_ffffffffffffffe8);
  __env = (__jmp_buf_tag *)SQCompilationContext::errorJump(in_RDI->_ctx);
  iVar1 = _setjmp(__env);
  if (iVar1 == 0) {
    Lex(in_RDI);
    pSVar4 = pSVar2;
    SVar3 = line(in_RDI);
    Node::setLineStartPos((Node *)pSVar2,(int)SVar3);
    local_8 = pSVar4;
    SVar3 = column(in_RDI);
    Node::setColumnStartPos((Node *)pSVar4,(int)SVar3);
    while (0 < in_RDI->_token) {
      pSVar4 = local_8;
      parseStatement(in_stack_00000178,in_stack_00000177);
      Block::addStatement((Block *)pSVar2,(Statement *)local_8);
      local_8 = pSVar4;
      if (((in_RDI->_lex)._prevtoken != 0x7d) && ((in_RDI->_lex)._prevtoken != 0x3b)) {
        OptionalSemicolon(pSVar2);
        local_8 = pSVar4;
      }
    }
    Node::setLineEndPos((Node *)local_8,(int)(in_RDI->_lex)._currentline);
    Node::setColumnEndPos((Node *)local_8,(int)(in_RDI->_lex)._currentcolumn);
  }
  else {
    local_8 = (SQParser *)0x0;
  }
  return (RootBlock *)local_8;
}

Assistant:

RootBlock* SQParser::parse()
{
    RootBlock *rootBlock = newNode<RootBlock>(arena());

    if(setjmp(_ctx.errorJump()) == 0) {
        Lex();
        rootBlock->setLineStartPos(line());
        rootBlock->setColumnStartPos(column());
        while(_token > 0){
            rootBlock->addStatement(parseStatement());
            if(_lex._prevtoken != _SC('}') && _lex._prevtoken != _SC(';')) OptionalSemicolon();
        }
        rootBlock->setLineEndPos(_lex._currentline);
        rootBlock->setColumnEndPos(_lex._currentcolumn);
    }
    else {
        return NULL;
    }

    return rootBlock;
}